

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O2

MinVarInfo * __thiscall
adios2::format::BP5Deserializer::MinBlocksInfo
          (BP5Deserializer *this,VariableBase *Var,size_t RelStep,size_t WriterRank,size_t BlockID)

{
  MinMaxStruct *this_00;
  int iVar1;
  DataType Type;
  BP5VarRec *VarRec;
  MinVarInfo *this_01;
  void *pvVar2;
  long lVar3;
  size_t Step;
  unsigned_long Step_00;
  long lVar4;
  size_type __n;
  size_t Step_1;
  unsigned_long Step_01;
  ulong local_b0;
  value_type local_88;
  
  VarRec = LookupVarByKey(this,Var);
  this_01 = (MinVarInfo *)operator_new(0x38);
  MinVarInfo::MinVarInfo(this_01,(int)VarRec->DimCount,VarRec->GlobalDims);
  Step_01 = RelStep;
  if (this->m_RandomAccessMode == true) {
    Step_01 = (VarRec->AbsStepFromRel).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[RelStep];
  }
  if (this->m_FlattenSteps == true) {
    local_b0 = ((long)(this->m_ControlArray).
                      super__Vector_base<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_ControlArray).
                     super__Vector_base<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x18;
    Step_01 = 0;
  }
  else {
    local_b0 = Step_01 + 1;
  }
  this_01->Step = RelStep;
  iVar1 = (int)VarRec->DimCount;
  this_01->Dims = iVar1;
  this_01->Shape = (size_t *)0x0;
  this_01->IsReverseDims = this->m_WriterIsRowMajor != this->m_ReaderIsRowMajor && 1 < iVar1;
  this_01->WasLocalValue = VarRec->OrigShapeID == LocalValue;
  __n = 0;
  for (Step_00 = Step_01; Step_00 < local_b0; Step_00 = Step_00 + 1) {
    pvVar2 = GetMetadataBase(this,VarRec,Step_00,WriterRank);
    if (pvVar2 != (void *)0x0) {
      if (this_01->Shape == (size_t *)0x0) {
        this_01->Shape = *(size_t **)((long)pvVar2 + 0x18);
      }
      __n = __n + 1;
    }
  }
  std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::reserve
            (&this_01->BlocksInfo,__n);
  this_00 = &local_88.MinMax;
  for (; Step_01 < local_b0; Step_01 = Step_01 + 1) {
    pvVar2 = GetMetadataBase(this,VarRec,Step_01,WriterRank);
    if (pvVar2 != (void *)0x0) {
      if (VarRec->MinMaxOffset == 0xffffffffffffffff) {
        lVar4 = 0;
      }
      else {
        lVar4 = *(long *)((long)pvVar2 + VarRec->MinMaxOffset);
      }
      lVar3 = (long)this_01->Dims * BlockID;
      local_88.Start = (size_t *)(*(long *)((long)pvVar2 + 0x28) + lVar3 * 8);
      if (*(long *)((long)pvVar2 + 0x28) == 0) {
        local_88.Start = (size_t *)0x0;
      }
      local_88.Count = (size_t *)(*(long *)((long)pvVar2 + 0x20) + lVar3 * 8);
      if (*(long *)((long)pvVar2 + 0x20) == 0) {
        local_88.Count = (size_t *)0x0;
      }
      local_88.BufferP = (void *)0x0;
      local_88.WriterID = (int)WriterRank;
      local_88.BlockID = BlockID;
      MinMaxStruct::Init(this_00,VarRec->Type);
      if (lVar4 != 0) {
        iVar1 = VarRec->ElementSize;
        Type = VarRec->Type;
        ApplyElementMinMax(this_00,Type,(void *)(BlockID * 2 * (long)iVar1 + lVar4));
        ApplyElementMinMax(this_00,Type,(void *)((long)iVar1 * (BlockID * 2 + 1) + lVar4));
      }
      std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::push_back
                (&this_01->BlocksInfo,&local_88);
    }
  }
  return this_01;
}

Assistant:

MinVarInfo *BP5Deserializer::MinBlocksInfo(const VariableBase &Var, size_t RelStep,
                                           size_t WriterRank, size_t BlockID)
{
    // this is only called for global and local arrays, so limited
    BP5VarRec *VarRec = LookupVarByKey((void *)&Var);

    MinVarInfo *MV = new MinVarInfo((int)VarRec->DimCount, VarRec->GlobalDims);

    size_t AbsStep = RelStep;
    size_t StepLoopStart, StepLoopEnd;

    if (m_RandomAccessMode)
    {
        AbsStep = VarRec->AbsStepFromRel[RelStep];
    }
    if (m_FlattenSteps)
    {
        StepLoopStart = 0;
        StepLoopEnd = m_ControlArray.size();
    }
    else
    {
        StepLoopStart = AbsStep;
        StepLoopEnd = AbsStep + 1;
    }
    size_t Id = 0;
    MV->Step = RelStep;
    MV->Dims = (int)VarRec->DimCount;
    MV->Shape = NULL;
    MV->IsReverseDims = ((MV->Dims > 1) && (m_WriterIsRowMajor != m_ReaderIsRowMajor));

    MV->WasLocalValue = (VarRec->OrigShapeID == ShapeID::LocalValue);
    if ((VarRec->OrigShapeID == ShapeID::LocalValue) ||
        (VarRec->OrigShapeID == ShapeID::GlobalValue))
    {
        // Throw
    }
    for (size_t Step = StepLoopStart; Step < StepLoopEnd; Step++)
    {
        MetaArrayRec *writer_meta_base = (MetaArrayRec *)GetMetadataBase(VarRec, Step, WriterRank);
        if (writer_meta_base)
        {
            if (MV->Shape == NULL)
            {
                MV->Shape = writer_meta_base->Shape;
            }
            Id += 1; // one block
        }
    }
    MV->BlocksInfo.reserve(Id);

    Id = BlockID;
    for (size_t Step = StepLoopStart; Step < StepLoopEnd; Step++)
    {
        MetaArrayRec *writer_meta_base = (MetaArrayRec *)GetMetadataBase(VarRec, Step, WriterRank);

        if (!writer_meta_base)
            continue;
        size_t WriterBlockCount = MV->Dims ? writer_meta_base->DBCount / MV->Dims : 1;
        if (BlockID >= WriterBlockCount)
        {
            // throw
        }
        MinMaxStruct *MMs = NULL;
        if (VarRec->MinMaxOffset != SIZE_MAX)
        {
            MMs = *(MinMaxStruct **)(((char *)writer_meta_base) + VarRec->MinMaxOffset);
        }
        size_t *Offsets = NULL;
        size_t *Count = NULL;
        if (writer_meta_base->Offsets)
            Offsets = writer_meta_base->Offsets + (BlockID * MV->Dims);
        if (writer_meta_base->Count)
            Count = writer_meta_base->Count + (BlockID * MV->Dims);
        MinBlockInfo Blk;
        Blk.WriterID = (int)WriterRank;
        Blk.BlockID = Id;
        Blk.Start = Offsets;
        Blk.Count = Count;
        Blk.MinMax.Init(VarRec->Type);
        if (MMs)
        {
            char *BlockMinAddr = (((char *)MMs) + 2 * BlockID * VarRec->ElementSize);
            char *BlockMaxAddr = (((char *)MMs) + (2 * BlockID + 1) * VarRec->ElementSize);
            ApplyElementMinMax(Blk.MinMax, VarRec->Type, (void *)BlockMinAddr);
            ApplyElementMinMax(Blk.MinMax, VarRec->Type, (void *)BlockMaxAddr);
        }
        // Blk.BufferP
        MV->BlocksInfo.push_back(Blk);
    }
    return MV;
}